

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

int Gia_ManQuantExist2(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar6;
  long extraout_RDX_02;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  uint Entry;
  Vec_Int_t *pVVar10;
  long lVar11;
  int OutLit;
  Vec_Int_t *vCis;
  int pLits [2];
  uint local_64;
  Vec_Int_t *local_60;
  Gia_Man_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Gia_Man_t *local_40;
  uint local_38;
  uint local_34;
  
  if (iLit < 0) {
LAB_00206118:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (p0->nObjs <= (int)((uint)iLit >> 1)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  local_64 = 0xffffffff;
  if (1 < (uint)iLit) {
    uVar9 = (uint)*(undefined8 *)(p0->pObjs + ((uint)iLit >> 1));
    if ((~uVar9 & 0x9fffffff) == 0) {
      iVar2 = (*pFuncCiToKeep)(pData,(uint)((ulong)*(undefined8 *)(p0->pObjs + ((uint)iLit >> 1)) >>
                                           0x20) & 0x1fffffff);
      if (iVar2 == 0) {
        iLit = 1;
      }
    }
    else {
      if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                      ,300,"int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)")
        ;
      }
      pGVar3 = Gia_ManQuantDupConeSupp(p0,iLit,pFuncCiToKeep,pData,&local_60,(int *)&local_64);
      iVar2 = pGVar3->iSuppPi;
      if (iVar2 == 0) {
        Gia_ManStop(pGVar3);
        if (local_60->pArray != (int *)0x0) {
          free(local_60->pArray);
        }
        free(local_60);
      }
      else {
        if ((iVar2 < 1) || (pGVar3->nSuppWords * 0x40 < iVar2)) {
          __assert_fail("pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x134,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 100;
        p->nSize = 0;
        piVar4 = (int *)malloc(400);
        p->pArray = piVar4;
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        pVVar5->nCap = 100;
        pVVar5->nSize = 0;
        piVar4 = (int *)malloc(400);
        pVVar5->pArray = piVar4;
        if ((int)local_64 < 2) {
          __assert_fail("OutLit > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x137,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        local_40 = p0;
        Vec_IntPush(p,local_64);
        iVar2 = pGVar3->iSuppPi;
        pGVar3->iSuppPi = iVar2 + -1;
        if (0 < iVar2) {
          local_48 = &pGVar3->vCopiesTwo;
          lVar6 = extraout_RDX;
          pVVar10 = p;
          local_58 = pGVar3;
          do {
            p = pVVar5;
            if (pVVar10->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*pVVar10->pArray < 0) goto LAB_00206118;
            iVar2 = pGVar3->nObjs * 2;
            if (((pGVar3->vCopiesTwo).nSize < iVar2) &&
               (Vec_IntFillExtra(local_48,iVar2,(int)lVar6), pVVar10->nSize < 1)) {
              __assert_fail("Vec_IntSize(vOuts) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                            ,0x142,
                            "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)"
                           );
            }
            p->nSize = 0;
            Gia_ManIncrementTravId(pGVar3);
            lVar6 = extraout_RDX_00;
            pVVar5 = pVVar10;
            if (0 < pVVar10->nSize) {
              lVar11 = 0;
              local_50 = pVVar10;
              do {
                uVar9 = local_50->pArray[lVar11];
                if ((int)uVar9 < 0) goto LAB_00206118;
                Gia_ManQuantExist_rec(pGVar3,uVar9 >> 1,(int *)&local_38);
                lVar6 = extraout_RDX_01;
                puVar7 = &local_38;
                bVar1 = true;
                do {
                  bVar8 = bVar1;
                  pVVar5 = local_50;
                  if ((int)*puVar7 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x132,"int Abc_LitNotCond(int, int)");
                  }
                  Entry = *puVar7 ^ uVar9 & 1;
                  if (Entry != 0) {
                    if (Entry == 1) {
                      if (local_50->pArray != (int *)0x0) {
                        free(local_50->pArray);
                      }
                      free(pVVar5);
                      pGVar3 = local_58;
                      if (p->pArray != (int *)0x0) {
                        free(p->pArray);
                      }
                      free(p);
                      Gia_ManStop(pGVar3);
                      if (local_60->pArray != (int *)0x0) {
                        free(local_60->pArray);
                      }
                      free(local_60);
                      return 1;
                    }
                    if (0 < (long)p->nSize) {
                      lVar6 = 0;
                      do {
                        if (p->pArray[lVar6] == Entry) goto LAB_00205f61;
                        lVar6 = lVar6 + 1;
                      } while (p->nSize != lVar6);
                    }
                    Vec_IntPush(p,Entry);
                    lVar6 = extraout_RDX_02;
                  }
LAB_00205f61:
                  puVar7 = &local_34;
                  bVar1 = false;
                } while (bVar8);
                lVar11 = lVar11 + 1;
                pGVar3 = local_58;
                pVVar5 = local_50;
              } while (lVar11 < local_50->nSize);
            }
            pVVar5->nSize = 0;
            iVar2 = pGVar3->iSuppPi;
            pGVar3->iSuppPi = iVar2 + -1;
            pVVar10 = p;
          } while (0 < iVar2);
        }
        if (p->nSize < 1) {
          __assert_fail("Vec_IntSize(vOuts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x15d,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        piVar4 = p->pArray;
        lVar6 = 0;
        do {
          uVar9 = piVar4[lVar6];
          if ((int)uVar9 < 0) goto LAB_002060f9;
          piVar4[lVar6] = uVar9 ^ 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nSize);
        local_64 = Gia_ManHashAndMulti(pGVar3,p);
        if ((int)local_64 < 0) {
LAB_002060f9:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        local_64 = local_64 ^ 1;
        Vec_IntFree(p);
        Vec_IntFree(pVVar5);
        Gia_ManAppendCo(pGVar3,local_64);
        iLit = Gia_ManDupConeBack(local_40,pGVar3,local_60);
        Gia_ManStop(pGVar3);
        Vec_IntFree(local_60);
      }
    }
  }
  return iLit;
}

Assistant:

int Gia_ManQuantExist2( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
//    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vOuts, * vOuts2, * vCis; 
    Gia_Obj_t * pObj = Gia_ManObj( p0, Abc_Lit2Var(iLit) );
    int i, n, Entry, Lit, OutLit = -1, pLits[2], nVarsQua, nAndsOld, nAndsNew; 
    if ( iLit < 2 ) return iLit;
    if ( Gia_ObjIsCi(pObj) ) return pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) ? iLit : 1;
    assert( Gia_ObjIsAnd(pObj) );
    pNew = Gia_ManQuantDupConeSupp( p0, iLit, pFuncCiToKeep, pData, &vCis, &OutLit );
    if ( pNew->iSuppPi == 0 )
    {
        Gia_ManStop( pNew );
        Vec_IntFree( vCis );
        return iLit;
    }
    assert( pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords );
    vOuts = Vec_IntAlloc( 100 );
    vOuts2 = Vec_IntAlloc( 100 );
    assert( OutLit > 1 );
    Vec_IntPush( vOuts, OutLit );
    nVarsQua = pNew->iSuppPi;
    nAndsOld = Gia_ManAndNum(pNew);
    while ( --pNew->iSuppPi >= 0 )
    {
        Entry = Abc_Lit2Var( Vec_IntEntry(vOuts, 0) );
//        printf( "Quantifying input %d with %d affected nodes (out of %d):\n", 
//            pNew->iSuppPi, Gia_ManQuantCountUsed(pNew,Entry), Gia_ManAndNum(pNew) );
        if ( Vec_IntSize(&pNew->vCopiesTwo) < 2*Gia_ManObjNum(pNew) )
            Vec_IntFillExtra( &pNew->vCopiesTwo, 2*Gia_ManObjNum(pNew), -1 );
        assert( Vec_IntSize(vOuts) > 0 );
        Vec_IntClear( vOuts2 );
        Gia_ManIncrementTravId( pNew );
        Vec_IntForEachEntry( vOuts, Entry, i )
        {
            Gia_ManQuantExist_rec( pNew, Abc_Lit2Var(Entry), pLits );
            for ( n = 0; n < 2; n++ )
            {
                Lit = Abc_LitNotCond( pLits[n], Abc_LitIsCompl(Entry) );
                if ( Lit == 0 )
                    continue;
                if ( Lit == 1 )
                {
                    Vec_IntFree( vOuts );
                    Vec_IntFree( vOuts2 );
                    Gia_ManStop( pNew );
                    Vec_IntFree( vCis );
                    return 1;
                }
                Vec_IntPushUnique( vOuts2, Lit );
            }
        }
        Vec_IntClear( vOuts );
        ABC_SWAP( Vec_Int_t *, vOuts, vOuts2 );
    }
//    printf( "\n" );
    //printf( "The number of diff cofactors = %d.\n", Vec_IntSize(vOuts) );
    assert( Vec_IntSize(vOuts) > 0 );
    Vec_IntForEachEntry( vOuts, Entry, i )
        Vec_IntWriteEntry( vOuts, i, Abc_LitNot(Entry) );
    OutLit = Gia_ManHashAndMulti( pNew, vOuts );
    OutLit = Abc_LitNot( OutLit );
    Vec_IntFree( vOuts );
    Vec_IntFree( vOuts2 );
    // transfer back
    Gia_ManAppendCo( pNew, OutLit );
    nAndsNew = Gia_ManAndNum(p0);
    Lit = Gia_ManDupConeBack( p0, pNew, vCis );
    nAndsNew = Gia_ManAndNum(p0) - nAndsNew;
    Gia_ManStop( pNew );
    // report the result
//    printf( "Performed quantification with %6d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d new nodes. \n", 
//        nAndsOld, Vec_IntSize(vCis) - nVarsQua, nVarsQua, nAndsNew );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vCis );
    return Lit;
}